

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

iter_type __thiscall
booster::locale::impl_icu::num_parse<char>::do_real_get<long_long>
          (num_parse<char> *this,iter_type in,iter_type end,ios_base *ios,iostate *err,longlong *val
          )

{
  byte *pbVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long *plVar8;
  int_type iVar9;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar10;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  streambuf_type *psVar11;
  ulong uVar12;
  iter_type iVar13;
  undefined1 auVar14 [16];
  iter_type iVar15;
  iter_type __beg;
  iter_type __end;
  _func_int **local_78;
  base_formatter local_68;
  num_parse<char> *local_60;
  string_type tmp;
  cast_type value;
  
  __end._M_sbuf = end._M_sbuf;
  psVar11 = in._M_sbuf;
  uVar7 = end._M_c;
  uVar6 = in._M_c;
  local_60 = this;
  plVar8 = (long *)__dynamic_cast(ios,&std::ios_base::typeinfo,&std::istream::typeinfo,
                                  0xffffffffffffffff);
  bVar3 = true;
  if (plVar8 == (long *)0x0) {
    local_78 = (_func_int **)0x0;
    bVar2 = false;
  }
  else {
    bVar3 = num_base::use_parent<long_long>(ios,0);
    if (bVar3) {
      local_78 = (_func_int **)0x0;
      bVar2 = false;
      bVar3 = true;
    }
    else {
      formatter<char>::create((formatter<char> *)&local_68,ios,&local_60->loc_,&local_60->enc_);
      local_78 = local_68._vptr_base_formatter;
      local_68._vptr_base_formatter = (_func_int **)0x0;
      bVar3 = local_78 == (_func_int **)0x0;
      bVar2 = true;
    }
  }
  if ((bVar2) && (local_68._vptr_base_formatter != (_func_int **)0x0)) {
    (**(code **)(*local_68._vptr_base_formatter + 8))();
  }
  if (!bVar3) {
    tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
    tmp._M_string_length = 0;
    tmp.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::reserve((ulong)&tmp);
    while( true ) {
      uVar4 = uVar6;
      if (uVar6 == 0xffffffff && psVar11 != (streambuf_type *)0x0) {
        if (*(byte **)(psVar11 + 0x10) < *(byte **)(psVar11 + 0x18)) {
          uVar4 = (uint)**(byte **)(psVar11 + 0x10);
        }
        else {
          uVar4 = (**(code **)(*(long *)psVar11 + 0x48))(psVar11);
        }
        if (uVar4 == 0xffffffff) {
          psVar11 = (streambuf_type *)0x0;
        }
      }
      uVar5 = uVar7;
      if (__end._M_sbuf != (streambuf_type *)0x0 && uVar7 == 0xffffffff) {
        if (*(byte **)(__end._M_sbuf + 0x10) < *(byte **)(__end._M_sbuf + 0x18)) {
          uVar5 = (uint)**(byte **)(__end._M_sbuf + 0x10);
        }
        else {
          uVar5 = (**(code **)(*(long *)__end._M_sbuf + 0x48))(__end._M_sbuf);
        }
        if (uVar5 == 0xffffffff) {
          __end._M_sbuf = (streambuf_type *)0x0;
        }
      }
      if ((uVar5 == 0xffffffff) == (uVar4 == 0xffffffff)) break;
      uVar4 = uVar6;
      if (psVar11 != (streambuf_type *)0x0 && uVar6 == 0xffffffff) {
        if (*(byte **)(psVar11 + 0x10) < *(byte **)(psVar11 + 0x18)) {
          uVar4 = (uint)**(byte **)(psVar11 + 0x10);
        }
        else {
          uVar4 = (**(code **)(*(long *)psVar11 + 0x48))(psVar11);
        }
        if (uVar4 == 0xffffffff) {
          psVar11 = (streambuf_type *)0x0;
        }
      }
      if ((char)uVar4 != '\x7f' && 0x1f < (byte)((char)uVar4 - 1U)) break;
      if (*(ulong *)(psVar11 + 0x10) < *(ulong *)(psVar11 + 0x18)) {
        *(ulong *)(psVar11 + 0x10) = *(ulong *)(psVar11 + 0x10) + 1;
        uVar6 = 0xffffffff;
      }
      else {
        uVar6 = 0xffffffff;
        (**(code **)(*(long *)psVar11 + 0x50))(psVar11);
      }
    }
    do {
      if (0xfff < tmp._M_string_length) goto LAB_0018ee0e;
      uVar4 = uVar6;
      if (uVar6 == 0xffffffff && psVar11 != (streambuf_type *)0x0) {
        if (*(byte **)(psVar11 + 0x10) < *(byte **)(psVar11 + 0x18)) {
          uVar4 = (uint)**(byte **)(psVar11 + 0x10);
        }
        else {
          uVar4 = (**(code **)(*(long *)psVar11 + 0x48))(psVar11);
        }
        if (uVar4 == 0xffffffff) {
          psVar11 = (streambuf_type *)0x0;
        }
      }
      uVar5 = uVar7;
      if (__end._M_sbuf != (streambuf_type *)0x0 && uVar7 == 0xffffffff) {
        if (*(byte **)(__end._M_sbuf + 0x10) < *(byte **)(__end._M_sbuf + 0x18)) {
          uVar5 = (uint)**(byte **)(__end._M_sbuf + 0x10);
        }
        else {
          uVar5 = (**(code **)(*(long *)__end._M_sbuf + 0x48))(__end._M_sbuf);
        }
        if (uVar5 == 0xffffffff) {
          __end._M_sbuf = (streambuf_type *)0x0;
        }
      }
      if ((uVar4 == 0xffffffff) == (uVar5 == 0xffffffff)) goto LAB_0018ee0e;
      if (psVar11 != (streambuf_type *)0x0 && uVar6 == 0xffffffff) {
        if (*(byte **)(psVar11 + 0x10) < *(byte **)(psVar11 + 0x18)) {
          uVar6 = (uint)**(byte **)(psVar11 + 0x10);
        }
        else {
          uVar6 = (**(code **)(*(long *)psVar11 + 0x48))(psVar11);
        }
        if (uVar6 == 0xffffffff) {
          psVar11 = (streambuf_type *)0x0;
        }
      }
      if ((char)uVar6 == '\n') goto LAB_0018ee0e;
      pbVar1 = *(byte **)(psVar11 + 0x10);
      if (pbVar1 < *(byte **)(psVar11 + 0x18)) {
        uVar6 = (uint)*pbVar1;
        *(byte **)(psVar11 + 0x10) = pbVar1 + 1;
      }
      else {
        uVar6 = (**(code **)(*(long *)psVar11 + 0x50))(psVar11);
      }
      if (((psVar11 != (streambuf_type *)0x0) && (uVar6 == 0xffffffff)) &&
         (*(ulong *)(psVar11 + 0x18) <= *(ulong *)(psVar11 + 0x10))) {
        (**(code **)(*(long *)psVar11 + 0x48))(psVar11);
      }
      uVar6 = 0xffffffff;
      std::__cxx11::string::push_back((char)&tmp);
    } while( true );
  }
  __beg._12_4_ = 0;
  __beg._M_sbuf = (streambuf_type *)SUB128(in._0_12_,0);
  __beg._M_c = SUB124(in._0_12_,8);
  __end._8_8_ = end._8_8_ & 0xffffffff;
  iVar13 = std::num_get<char,std::istreambuf_iterator<char,std::char_traits<char>>>::
           _M_extract_int_abi_cxx11_<long_long>
                     ((num_get<char,std::istreambuf_iterator<char,std::char_traits<char>>> *)
                      local_60,__beg,__end,ios,err,val);
  iVar9 = iVar13._M_c;
LAB_0018eef3:
  if (local_78 != (_func_int **)0x0) {
    (**(code **)(*local_78 + 8))(local_78);
  }
  iVar15._M_c = iVar9;
  iVar15._M_sbuf = iVar13._M_sbuf;
  iVar15._12_4_ = 0;
  return iVar15;
LAB_0018ee0e:
  auVar14 = (**(code **)(*local_78 + 0x30))(local_78,&tmp,&value);
  uVar10 = auVar14._8_8_;
  uVar12 = tmp._M_string_length;
  if (auVar14._0_8_ == 0) {
    *(undefined1 *)err = (char)*err | _S_failbit;
  }
  else {
    *val = value;
  }
  for (; auVar14._0_8_ < uVar12; uVar12 = uVar12 - 1) {
    std::istream::putback((char)plVar8);
    uVar10 = extraout_RDX;
  }
  psVar11 = *(streambuf_type **)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0xe8);
  if (psVar11 == (streambuf_type *)0x0) {
    bVar3 = true;
  }
  else {
    if (*(byte **)(psVar11 + 0x10) < *(byte **)(psVar11 + 0x18)) {
      uVar6 = (uint)**(byte **)(psVar11 + 0x10);
    }
    else {
      uVar6 = (**(code **)(*(long *)psVar11 + 0x48))(psVar11);
      uVar10 = extraout_RDX_01;
    }
    bVar3 = uVar6 == 0xffffffff;
    if (bVar3) {
      psVar11 = (streambuf_type *)0x0;
    }
  }
  if (__end._M_sbuf != (streambuf_type *)0x0 && uVar7 == 0xffffffff) {
    if (*(byte **)(__end._M_sbuf + 0x10) < *(byte **)(__end._M_sbuf + 0x18)) {
      uVar7 = (uint)**(byte **)(__end._M_sbuf + 0x10);
    }
    else {
      uVar7 = (**(code **)(*(long *)__end._M_sbuf + 0x48))(__end._M_sbuf);
      uVar10 = extraout_RDX_02;
    }
  }
  if ((bool)(bVar3 ^ uVar7 != 0xffffffff)) {
    *(undefined1 *)err = (char)*err | _S_eofbit;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tmp._M_dataplus._M_p != &tmp.field_2) {
    operator_delete(tmp._M_dataplus._M_p);
    uVar10 = extraout_RDX_00;
  }
  iVar13._8_8_ = uVar10;
  iVar13._M_sbuf = psVar11;
  iVar9 = -1;
  goto LAB_0018eef3;
}

Assistant:

iter_type do_real_get(iter_type in,iter_type end,std::ios_base &ios,std::ios_base::iostate &err,ValueType &val) const
    {
        formatter_ptr formatter;
        stream_type *stream_ptr = dynamic_cast<stream_type *>(&ios);

        if(!stream_ptr || use_parent<ValueType>(ios,0) || (formatter = formatter_type::create(ios,loc_,enc_)).get()==0) {
            return std::num_get<CharType>::do_get(in,end,ios,err,val);
        }

        typedef typename details::cast_traits<ValueType>::cast_type cast_type;
        string_type tmp;
        tmp.reserve(64);

        CharType c;
        while(in!=end && (((c=*in)<=32 && (c>0)) || c==127)) // Assuming that ASCII is a subset
            ++in;

        while(tmp.size() < 4096 && in!=end && *in!='\n') {
            tmp += *in++;
        }

        cast_type value;
        size_t parsed_chars;

        if((parsed_chars = formatter->parse(tmp,value))==0 || !valid<ValueType>(value)) {
            err |= std::ios_base::failbit;
        }
        else {
            val=static_cast<ValueType>(value);
        }

        for(size_t n=tmp.size();n>parsed_chars;n--) {
            stream_ptr->putback(tmp[n-1]);
        }

        in = iter_type(*stream_ptr);

        if(in==end)
            err |=std::ios_base::eofbit;
        return in;
    }